

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmap.h
# Opt level: O3

ProStringList * __thiscall
QMap<ProString,_ProStringList>::operator[](QMap<ProString,_ProStringList> *this,ProString *key)

{
  QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>
  *pQVar1;
  iterator iVar2;
  long in_FS_OFFSET;
  pair<std::_Rb_tree_iterator<std::pair<const_ProString,_ProStringList>_>,_bool> pVar3;
  QArrayDataPointer<ProString> local_88;
  pair<const_ProString,_ProStringList> local_70;
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>_>
  local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_28.d.ptr =
       (totally_ordered_wrapper<QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>_*>
        )(this->d).d.ptr;
  if ((local_28.d.ptr ==
       (QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>
        *)0x0) ||
     ((__atomic_base<int>)
      *(__int_type *)
       &(((QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>
           *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value == (__atomic_base<int>)0x1)) {
    local_28.d.ptr =
         (totally_ordered_wrapper<QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>_*>
          )(QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>
            *)0x0;
  }
  else {
    LOCK();
    (((QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>
       *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>
                        *)local_28.d.ptr)->super_QSharedData).ref.super_QAtomicInteger<int>.
                     super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  detach(this);
  iVar2 = std::
          _Rb_tree<ProString,_std::pair<const_ProString,_ProStringList>,_std::_Select1st<std::pair<const_ProString,_ProStringList>_>,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>
          ::find(&(((this->d).d.ptr)->m)._M_t,key);
  pQVar1 = (this->d).d.ptr;
  if ((_Rb_tree_header *)iVar2._M_node == &(pQVar1->m)._M_t._M_impl.super__Rb_tree_header) {
    ProString::ProString(&local_70.first,key);
    local_88.d = (Data *)0x0;
    local_88.ptr = (ProString *)0x0;
    local_70.second.super_QList<ProString>.d.d = (Data *)0x0;
    local_70.second.super_QList<ProString>.d.ptr = (ProString *)0x0;
    local_70.second.super_QList<ProString>.d.size = 0;
    local_88.size = 0;
    pVar3 = std::
            _Rb_tree<ProString,std::pair<ProString_const,ProStringList>,std::_Select1st<std::pair<ProString_const,ProStringList>>,std::less<ProString>,std::allocator<std::pair<ProString_const,ProStringList>>>
            ::_M_insert_unique<std::pair<ProString_const,ProStringList>>
                      ((_Rb_tree<ProString,std::pair<ProString_const,ProStringList>,std::_Select1st<std::pair<ProString_const,ProStringList>>,std::less<ProString>,std::allocator<std::pair<ProString_const,ProStringList>>>
                        *)&pQVar1->m,&local_70);
    iVar2._M_node = (_Base_ptr)pVar3.first._M_node;
    QArrayDataPointer<ProString>::~QArrayDataPointer
              ((QArrayDataPointer<ProString> *)&local_70.second);
    if (&(local_70.first.m_string.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_70.first.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i
           = ((local_70.first.m_string.d.d)->super_QArrayData).ref_._q_value.
             super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_70.first.m_string.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
          _M_i == 0) {
        QArrayData::deallocate(&(local_70.first.m_string.d.d)->super_QArrayData,2,0x10);
      }
    }
    QArrayDataPointer<ProString>::~QArrayDataPointer(&local_88);
  }
  QtPrivate::
  QExplicitlySharedDataPointerV2<QMapData<std::map<ProString,_ProStringList,_std::less<ProString>,_std::allocator<std::pair<const_ProString,_ProStringList>_>_>_>_>
  ::~QExplicitlySharedDataPointerV2(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (ProStringList *)&iVar2._M_node[2]._M_left;
  }
  __stack_chk_fail();
}

Assistant:

T &operator[](const Key &key)
    {
        const auto copy = d.isShared() ? *this : QMap(); // keep `key` alive across the detach
        detach();
        auto i = d->m.find(key);
        if (i == d->m.end())
            i = d->m.insert({key, T()}).first;
        return i->second;
    }